

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O0

bool __thiscall GraphPropagator::propagate(GraphPropagator *this)

{
  bool bVar1;
  int iVar2;
  GraphPropagator *in_RDI;
  int in_stack_0000000c;
  int i_1;
  int i;
  int e;
  int local_18;
  int local_14;
  
  local_14 = 0;
  while (e = local_14, iVar2 = nbNodes((GraphPropagator *)0x2a8dbd), e < iVar2) {
    getNodeVar(in_RDI,e);
    bVar1 = BoolView::isFixed((BoolView *)0x2a8ddd);
    if (bVar1) {
      getNodeVar(in_RDI,e);
      bVar1 = BoolView::isFalse((BoolView *)in_RDI);
      if ((bVar1) && (bVar1 = coherence_outedges(_i_1,in_stack_0000000c), !bVar1)) {
        return false;
      }
    }
    local_14 = local_14 + 1;
  }
  local_18 = 0;
  do {
    iVar2 = nbEdges((GraphPropagator *)0x2a8e48);
    if (iVar2 <= local_18) {
      return true;
    }
    getEdgeVar(in_RDI,e);
    bVar1 = BoolView::isFixed((BoolView *)0x2a8e67);
    if (bVar1) {
      getEdgeVar(in_RDI,e);
      bVar1 = BoolView::isTrue((BoolView *)in_RDI);
      if ((bVar1) && (bVar1 = coherence_innodes(_i_1,in_stack_0000000c), !bVar1)) {
        return false;
      }
    }
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

bool GraphPropagator::propagate() {
	for (int i = 0; i < nbNodes(); i++) {
		if (getNodeVar(i).isFixed() && getNodeVar(i).isFalse()) {
			if (!coherence_outedges(i)) {
				return false;
			}
		}
	}
	for (int i = 0; i < nbEdges(); i++) {
		if (getEdgeVar(i).isFixed() && getEdgeVar(i).isTrue()) {
			if (!coherence_innodes(i)) {
				return false;
			}
		}
	}
	return true;
}